

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall Liby::Connection::handleWritEvent(Connection *this)

{
  bool bVar1;
  int __out_fd;
  element_type *this_00;
  element_type *peVar2;
  reference pvVar3;
  size_type sVar4;
  ssize_t sVar5;
  reference pvVar6;
  element_type *peVar7;
  off_t oVar8;
  type pfVar9;
  int *piVar10;
  off_t in_RCX;
  size_t in_R8;
  off_t firstBufferSize;
  undefined1 auStack_108 [4];
  int ret_1;
  iovec v;
  io_task *x_1;
  iterator __end3;
  iterator __begin3;
  deque<Liby::io_task,_std::allocator<Liby::io_task>_> *__range3;
  vector<iovec,_std::allocator<iovec>_> iov;
  undefined8 uStack_88;
  int ret;
  off_t offset;
  value_type *first;
  anon_class_8_1_8991fb9c local_68;
  function<void_()> local_60;
  DeferCaller local_40;
  undefined1 local_20 [8];
  ConnPtr x;
  Connection *this_local;
  
  x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::shared_ptr<Liby::Connection>::shared_ptr
            ((shared_ptr<Liby::Connection> *)local_20,&this->self_);
  local_68.this = this;
  std::function<void()>::function<Liby::Connection::handleWritEvent()::__0,void>
            ((function<void()> *)&local_60,&local_68);
  DeferCaller::DeferCaller(&local_40,&local_60);
  DeferCaller::~DeferCaller(&local_40);
  std::function<void_()>::~function(&local_60);
  do {
    while( true ) {
      bVar1 = std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::empty(&this->writTasks_);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 0;
        goto LAB_0013477a;
      }
      offset = (off_t)std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::front
                                (&this->writTasks_);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)offset);
      if (!bVar1) break;
      uStack_88 = *(undefined8 *)(offset + 0x10);
      peVar2 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->socket_);
      this_00 = std::
                __shared_ptr_access<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)offset);
      __out_fd = FileDescriptor::fd(this_00);
      sVar5 = Socket::sendfile(peVar2,__out_fd,(int)&stack0xffffffffffffff78,
                               *(off_t **)(offset + 0x18),in_R8);
      iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = (int)sVar5;
      if (iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < 1) {
        if ((iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ == 0) || (piVar10 = __errno_location(), *piVar10 != 0xb)) {
          handleErroEvent(this);
          iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
        }
        else {
          iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
        }
        goto LAB_0013477a;
      }
      if ((long)iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ != *(long *)(offset + 0x18)) {
        *(long *)(offset + 0x18) =
             *(long *)(offset + 0x18) -
             (long)iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
        *(long *)(offset + 0x10) =
             (long)iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + *(long *)(offset + 0x10);
        iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
        goto LAB_0013477a;
      }
      in_RCX = offset;
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(offset + 0x30));
      if (bVar1) {
        pfVar9 = std::
                 unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
                 operator*((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                            *)(offset + 0x30));
        std::function<void_()>::operator()(pfVar9);
      }
      std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::pop_front(&this->writTasks_);
    }
    std::vector<iovec,_std::allocator<iovec>_>::vector
              ((vector<iovec,_std::allocator<iovec>_> *)&__range3);
    std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::begin
              ((iterator *)&__end3._M_node,&this->writTasks_);
    std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::end
              ((iterator *)&x_1,&this->writTasks_);
    while (bVar1 = std::operator!=((_Self *)&__end3._M_node,(_Self *)&x_1), bVar1) {
      v.iov_len = (size_t)std::_Deque_iterator<Liby::io_task,_Liby::io_task_&,_Liby::io_task_*>::
                          operator*((_Deque_iterator<Liby::io_task,_Liby::io_task_&,_Liby::io_task_*>
                                     *)&__end3._M_node);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)v.iov_len);
      if ((bVar1) ||
         (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(v.iov_len + 0x20)),
         !bVar1)) break;
      peVar7 = std::__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(v.iov_len + 0x20));
      _auStack_108 = Buffer::data(peVar7);
      peVar7 = std::__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(v.iov_len + 0x20));
      v.iov_base = (void *)Buffer::size(peVar7);
      std::vector<iovec,_std::allocator<iovec>_>::push_back
                ((vector<iovec,_std::allocator<iovec>_> *)&__range3,(value_type *)auStack_108);
      std::_Deque_iterator<Liby::io_task,_Liby::io_task_&,_Liby::io_task_*>::operator++
                ((_Deque_iterator<Liby::io_task,_Liby::io_task_&,_Liby::io_task_*> *)&__end3._M_node
                );
    }
    peVar2 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->socket_);
    pvVar3 = std::vector<iovec,_std::allocator<iovec>_>::operator[]
                       ((vector<iovec,_std::allocator<iovec>_> *)&__range3,0);
    sVar4 = std::vector<iovec,_std::allocator<iovec>_>::size
                      ((vector<iovec,_std::allocator<iovec>_> *)&__range3);
    sVar5 = Socket::writev(peVar2,(int)pvVar3,(iovec *)(sVar4 & 0xffffffff),(int)in_RCX);
    firstBufferSize._4_4_ = (int)sVar5;
    if (firstBufferSize._4_4_ < 1) {
      if ((firstBufferSize._4_4_ == 0) || (piVar10 = __errno_location(), *piVar10 != 0xb)) {
        handleErroEvent(this);
        iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
      }
      else {
        iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
      }
    }
    else {
      while (0 < firstBufferSize._4_4_) {
        pvVar6 = std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::front(&this->writTasks_)
        ;
        peVar7 = std::__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pvVar6->buffer_);
        oVar8 = Buffer::size(peVar7);
        in_RCX = (off_t)firstBufferSize._4_4_;
        if (in_RCX < oVar8) {
          pvVar6 = std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::front
                             (&this->writTasks_);
          peVar7 = std::__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pvVar6->buffer_);
          Buffer::retrieve(peVar7,(long)firstBufferSize._4_4_);
          iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
          goto LAB_00134751;
        }
        firstBufferSize._4_4_ = firstBufferSize._4_4_ - (int)oVar8;
        pvVar6 = std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::front(&this->writTasks_)
        ;
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pvVar6->handler_);
        if (bVar1) {
          pvVar6 = std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::front
                             (&this->writTasks_);
          pfVar9 = std::
                   unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                   ::operator*(&pvVar6->handler_);
          std::function<void_()>::operator()(pfVar9);
          if ((this->destroy_ & 1U) != 0) {
            iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._0_4_ = 1;
            in_RCX = oVar8;
            goto LAB_00134751;
          }
        }
        std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::pop_front(&this->writTasks_);
        in_RCX = oVar8;
      }
      iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
    }
LAB_00134751:
    std::vector<iovec,_std::allocator<iovec>_>::~vector
              ((vector<iovec,_std::allocator<iovec>_> *)&__range3);
  } while ((int)iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == 0);
LAB_0013477a:
  std::shared_ptr<Liby::Connection>::~shared_ptr((shared_ptr<Liby::Connection> *)local_20);
  return;
}

Assistant:

void Connection::handleWritEvent() {
    //    if (writTasks_.empty()) {
    //
    //        return;
    //    }

    auto x = self_;
    DeferCaller([this] {
        if (destroy_)
            return;
        if (writTasks_.empty())
            enableWrit(false);
    });
    //    enableWrit(false);

    //    ssize_t bytes = 0; // 注: sendfile的字节数不计入bytes中
    while (!writTasks_.empty()) {
        auto &first = writTasks_.front();
        if (first.fp_) {
            off_t offset = first.offset_;
            int ret = socket_->sendfile(first.fp_->fd(), &offset, first.len_);
            if (ret <= 0) {
                if (ret != 0 && errno == EAGAIN) {
                    return;
                } else {
                    handleErroEvent();
                    return;
                }
            } else if (ret == first.len_) {
                if (first.handler_) {
                    (*first.handler_)();
                }
                writTasks_.pop_front();
                continue;
            } else {
                first.len_ -= ret;
                first.offset_ += ret;
                return;
            }
        } else {
            std::vector<struct iovec> iov;
            for (auto &x : writTasks_) {
                if (!x.fp_ && x.buffer_) {
                    struct iovec v;
                    v.iov_base = x.buffer_->data();
                    v.iov_len = x.buffer_->size();
                    iov.push_back(v);
                } else {
                    break;
                }
            }
            auto ret = socket_->writev(&iov[0], iov.size());
            if (ret > 0) {
                while (ret > 0) {
                    auto firstBufferSize = writTasks_.front().buffer_->size();
                    if (firstBufferSize <= ret) {
                        ret -= firstBufferSize;
                        if (writTasks_.front().handler_) {
                            (*writTasks_.front().handler_)();
                            if (destroy_)
                                return;
                        }
                        writTasks_.pop_front();
                    } else {
                        writTasks_.front().buffer_->retrieve(ret);
                        return;
                    }
                }
            } else {
                if (ret != 0 && errno == EAGAIN) {
                    return;
                } else {
                    handleErroEvent();
                    return;
                }
            }
        }
    }
}